

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_mark.cpp
# Opt level: O3

Read<signed_char> __thiscall
Omega_h::mark_adj(Omega_h *this,Mesh *mesh,Int from_dim,Int to_dim,Read<signed_char> *from_marked)

{
  int *piVar1;
  undefined4 in_register_00000014;
  void *extraout_RDX;
  Alloc *pAVar3;
  bool bVar4;
  Read<signed_char> RVar5;
  Read<signed_char> local_38;
  Read<signed_char> local_28;
  void *pvVar2;
  
  if (from_dim == to_dim) {
    pAVar3 = (from_marked->write_).shared_alloc_.alloc;
    *(Alloc **)this = pAVar3;
    *(void **)(this + 8) = (from_marked->write_).shared_alloc_.direct_ptr;
    bVar4 = ((ulong)pAVar3 & 7) != 0;
    pvVar2 = (void *)CONCAT71((int7)(CONCAT44(in_register_00000014,from_dim) >> 8),
                              bVar4 || pAVar3 == (Alloc *)0x0);
    if ((!bVar4 && pAVar3 != (Alloc *)0x0) && (entering_parallel == '\x01')) {
      pAVar3->use_count = pAVar3->use_count + -1;
      *(size_t *)this = pAVar3->size * 8 + 1;
    }
    (from_marked->write_).shared_alloc_.alloc = (Alloc *)0x0;
    (from_marked->write_).shared_alloc_.direct_ptr = (void *)0x0;
  }
  else {
    if (from_dim < to_dim) {
      local_28.write_.shared_alloc_.alloc = (from_marked->write_).shared_alloc_.alloc;
      if (((ulong)local_28.write_.shared_alloc_.alloc & 7) == 0 &&
          local_28.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_28.write_.shared_alloc_.alloc =
               (Alloc *)((local_28.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_28.write_.shared_alloc_.alloc)->use_count =
               (local_28.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      pAVar3 = local_28.write_.shared_alloc_.alloc;
      local_28.write_.shared_alloc_.direct_ptr = (from_marked->write_).shared_alloc_.direct_ptr;
      RVar5 = mark_up(this,mesh,from_dim,to_dim,&local_28);
      pvVar2 = RVar5.write_.shared_alloc_.direct_ptr;
    }
    else {
      if (from_dim <= to_dim) {
        fail("assertion %s failed at %s +%d\n","false",
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mark.cpp"
             ,0x45);
      }
      local_38.write_.shared_alloc_.alloc = (from_marked->write_).shared_alloc_.alloc;
      if (((ulong)local_38.write_.shared_alloc_.alloc & 7) == 0 &&
          local_38.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_38.write_.shared_alloc_.alloc =
               (Alloc *)((local_38.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_38.write_.shared_alloc_.alloc)->use_count =
               (local_38.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_38.write_.shared_alloc_.direct_ptr = (from_marked->write_).shared_alloc_.direct_ptr;
      RVar5 = mark_down(this,mesh,from_dim,to_dim,&local_38);
      pvVar2 = RVar5.write_.shared_alloc_.direct_ptr;
      pAVar3 = local_38.write_.shared_alloc_.alloc;
    }
    if (((ulong)pAVar3 & 7) == 0 && pAVar3 != (Alloc *)0x0) {
      piVar1 = &pAVar3->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(pAVar3);
        operator_delete(pAVar3,0x48);
        pvVar2 = extraout_RDX;
      }
    }
  }
  RVar5.write_.shared_alloc_.direct_ptr = pvVar2;
  RVar5.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar5.write_.shared_alloc_;
}

Assistant:

Read<I8> mark_adj(Mesh* mesh, Int from_dim, Int to_dim, Read<I8> from_marked) {
  if (from_dim == to_dim) return from_marked;
  if (from_dim < to_dim) return mark_up(mesh, from_dim, to_dim, from_marked);
  if (from_dim > to_dim) return mark_down(mesh, from_dim, to_dim, from_marked);
  OMEGA_H_NORETURN(Read<I8>());
}